

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_xmove(lua_State *from,lua_State *to,int n)

{
  Value *pVVar1;
  Value VVar2;
  StkId pTVar3;
  long lVar4;
  
  if ((from != to) && (from->top = from->top + -(long)n, 0 < n)) {
    pTVar3 = to->top;
    lVar4 = 0;
    do {
      pVVar1 = (Value *)((long)&from->top->value_ + lVar4);
      VVar2 = pVVar1[1];
      pTVar3->value_ = *pVVar1;
      *(Value *)&pTVar3->tt_ = VVar2;
      pTVar3 = to->top + 1;
      to->top = pTVar3;
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)n << 4 != lVar4);
  }
  return;
}

Assistant:

LUA_API void lua_xmove (lua_State *from, lua_State *to, int n) {
  int i;
  if (from == to) return;
  lua_lock(to);
  api_checknelems(from, n);
  api_check(from, G(from) == G(to), "moving among independent states");
  api_check(from, to->ci->top - to->top >= n, "stack overflow");
  from->top -= n;
  for (i = 0; i < n; i++) {
    setobj2s(to, to->top, from->top + i);
    to->top++;  /* stack already checked by previous 'api_check' */
  }
  lua_unlock(to);
}